

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O1

LightLeSample * __thiscall
pbrt::UniformInfiniteLight::SampleLe
          (LightLeSample *__return_storage_ptr__,UniformInfiniteLight *this,Point2f *u1,Point2f *u2,
          SampledWavelengths *lambda,Float time)

{
  undefined4 uVar1;
  undefined4 uVar3;
  undefined8 uVar2;
  float fVar4;
  undefined1 auVar5 [16];
  bool bVar6;
  undefined1 auVar7 [16];
  float fVar8;
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  float fVar14;
  float fVar15;
  float fVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar20 [64];
  undefined1 auVar22 [56];
  undefined1 auVar21 [64];
  float fVar23;
  float fVar28;
  float fVar29;
  undefined1 auVar24 [16];
  float fVar31;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar30 [56];
  undefined1 auVar27 [64];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  float fVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  float fVar38;
  undefined1 auVar39 [16];
  SampledSpectrum SVar40;
  float local_98;
  float fStack_94;
  float local_78;
  undefined1 auVar19 [64];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  
  auVar25 = vfmadd132ss_fma(ZEXT416((uint)(u1->super_Tuple2<pbrt::Point2,_float>).x),
                            SUB6416(ZEXT464(0x3f800000),0),ZEXT416(0xc0000000));
  auVar17._8_4_ = 0x80000000;
  auVar17._0_8_ = 0x8000000080000000;
  auVar17._12_4_ = 0x80000000;
  auVar10 = vxorps_avx512vl(auVar25,auVar17);
  auVar17 = vfnmadd231ss_fma(SUB6416(ZEXT464(0x3f800000),0),auVar25,auVar25);
  auVar17 = vmaxss_avx(auVar17,ZEXT816(0) << 0x20);
  if (auVar17._0_4_ < 0.0) {
    auVar19._0_4_ = sqrtf(auVar17._0_4_);
    auVar19._4_60_ = extraout_var;
    auVar17 = auVar19._0_16_;
  }
  else {
    auVar17 = vsqrtss_avx(auVar17,auVar17);
  }
  fVar9 = (u1->super_Tuple2<pbrt::Point2,_float>).y * 6.2831855;
  fVar14 = cosf(fVar9);
  auVar20._0_4_ = sinf(fVar9);
  auVar20._4_60_ = extraout_var_00;
  fVar9 = (u2->super_Tuple2<pbrt::Point2,_float>).x;
  fVar15 = (u2->super_Tuple2<pbrt::Point2,_float>).y;
  auVar11._0_4_ = fVar9 + fVar9;
  auVar11._4_4_ = fVar15 + fVar15;
  auVar11._8_8_ = 0;
  auVar36._8_4_ = 0xbf800000;
  auVar36._0_8_ = 0xbf800000bf800000;
  auVar36._12_4_ = 0xbf800000;
  auVar11 = vaddps_avx512vl(auVar11,auVar36);
  auVar36 = vmovshdup_avx(auVar11);
  fVar15 = auVar11._0_4_;
  fVar9 = auVar36._0_4_;
  if ((fVar15 == 0.0) && (!NAN(fVar15))) {
    auVar36 = ZEXT816(0) << 0x40;
    if ((fVar9 == 0.0) && (!NAN(fVar9))) goto LAB_00333242;
  }
  auVar12._8_4_ = 0x7fffffff;
  auVar12._0_8_ = 0x7fffffff7fffffff;
  auVar12._12_4_ = 0x7fffffff;
  auVar12 = vandps_avx512vl(auVar11,auVar12);
  auVar36 = vshufps_avx(auVar12,auVar12,0xf5);
  bVar6 = auVar36._0_4_ < auVar12._0_4_;
  auVar13._0_4_ = fVar15 / fVar9;
  auVar13._4_12_ = auVar11._4_12_;
  auVar36 = vfmadd213ss_fma(SUB6416(ZEXT464(0xbf490fdb),0),auVar13,ZEXT416(0x3fc90fdb));
  fVar8 = (float)((uint)bVar6 * (int)((fVar9 / fVar15) * 0.7853982) + (uint)!bVar6 * auVar36._0_4_);
  fVar9 = (float)((uint)bVar6 * (int)fVar15 + (uint)!bVar6 * (int)fVar9);
  fVar15 = cosf(fVar8);
  fVar8 = sinf(fVar8);
  auVar36 = vinsertps_avx(ZEXT416((uint)(fVar9 * fVar15)),ZEXT416((uint)(fVar9 * fVar8)),0x10);
LAB_00333242:
  fVar9 = this->scale;
  fVar15 = this->sceneRadius;
  auVar24._8_4_ = 0x3f800000;
  auVar24._0_8_ = 0x3f8000003f800000;
  auVar24._12_4_ = 0x3f800000;
  auVar18._8_4_ = 0x80000000;
  auVar18._0_8_ = 0x8000000080000000;
  auVar18._12_4_ = 0x80000000;
  auVar11 = vpternlogd_avx512vl(auVar10,auVar24,auVar18,0xec);
  fVar14 = auVar17._0_4_ * fVar14;
  auVar39._0_4_ = -fVar14;
  auVar39._4_4_ = 0x80000000;
  auVar39._8_4_ = 0x80000000;
  auVar39._12_4_ = 0x80000000;
  local_78 = auVar25._0_4_;
  fVar38 = auVar11._0_4_;
  fVar16 = -1.0 / (fVar38 - local_78);
  uVar1 = (this->sceneCenter).super_Tuple3<pbrt::Point3,_float>.x;
  uVar3 = (this->sceneCenter).super_Tuple3<pbrt::Point3,_float>.y;
  auVar17 = vinsertps_avx(auVar11,auVar17,0x1c);
  auVar25 = vinsertps_avx(auVar39,auVar20._0_16_,0x1c);
  fVar23 = auVar17._0_4_ * auVar25._0_4_;
  fVar28 = auVar17._4_4_ * auVar25._4_4_;
  fVar29 = auVar17._8_4_ * auVar25._8_4_;
  fVar31 = auVar17._12_4_ * auVar25._12_4_;
  fVar35 = auVar36._0_4_;
  auVar25._0_4_ = fVar23 * fVar35;
  auVar25._4_4_ = fVar28 * auVar36._4_4_;
  auVar25._8_4_ = fVar29 * auVar36._8_4_;
  auVar25._12_4_ = fVar31 * auVar36._12_4_;
  auVar25 = vmovshdup_avx(auVar25);
  auVar30 = (undefined1  [56])0x0;
  fVar8 = (this->sceneCenter).super_Tuple3<pbrt::Point3,_float>.z;
  auVar22 = (undefined1  [56])0x0;
  SVar40 = DenselySampledSpectrum::Sample(&this->Lemit,lambda);
  auVar27._0_8_ = SVar40.values.values._8_8_;
  auVar27._8_56_ = auVar30;
  auVar21._0_8_ = SVar40.values.values._0_8_;
  auVar21._8_56_ = auVar22;
  auVar17 = vmovlhps_avx(auVar21._0_16_,auVar27._0_16_);
  auVar7._4_4_ = fVar28;
  auVar7._0_4_ = fVar23;
  auVar7._8_4_ = fVar29;
  auVar7._12_4_ = fVar31;
  auVar10 = vmovshdup_avx(auVar7);
  fVar4 = fVar16 * fVar14 * auVar10._0_4_;
  auVar12 = vpermi2ps_avx512vl(_DAT_0287a110,ZEXT416((uint)(fVar38 * fVar4)),ZEXT416((uint)fVar4));
  auVar10 = vshufps_avx(auVar36,auVar36,0xe1);
  auVar32._0_4_ = fVar23 * auVar39._0_4_;
  auVar32._4_4_ = fVar28 * fVar28;
  auVar32._8_4_ = fVar29 * fVar29;
  auVar32._12_4_ = fVar31 * fVar31;
  auVar34._4_4_ = fVar16;
  auVar34._0_4_ = fVar16;
  auVar34._8_4_ = fVar16;
  auVar34._12_4_ = fVar16;
  auVar37._8_4_ = 0x3f800000;
  auVar37._0_8_ = 0x3f8000003f800000;
  auVar37._12_4_ = 0x3f800000;
  auVar11 = vunpcklps_avx(auVar37,auVar11);
  auVar11 = vfmadd231ps_fma(auVar11,auVar32,auVar34);
  auVar33._4_12_ = auVar7._4_12_;
  auVar33._0_4_ = fVar14;
  auVar5._8_4_ = 0x80000000;
  auVar5._0_8_ = 0x8000000080000000;
  auVar5._12_4_ = 0x80000000;
  auVar13 = vmulps_avx512vl(auVar33,auVar5);
  auVar26._0_4_ =
       fVar15 * (auVar12._0_4_ * auVar10._0_4_ + fVar35 * auVar11._0_4_ + auVar13._0_4_) +
       (float)uVar1;
  auVar26._4_4_ =
       fVar15 * (auVar12._4_4_ * auVar10._4_4_ + auVar36._4_4_ * auVar11._4_4_ + auVar13._4_4_) +
       (float)uVar3;
  auVar26._8_4_ =
       fVar15 * (auVar12._8_4_ * auVar10._8_4_ + auVar36._8_4_ * auVar11._8_4_ + auVar13._8_4_) +
       0.0;
  auVar26._12_4_ =
       fVar15 * (auVar12._12_4_ * auVar10._12_4_ + auVar36._12_4_ * auVar11._12_4_ + auVar13._12_4_)
       + 0.0;
  auVar10._0_4_ = fVar14 * fVar15;
  auVar10._4_4_ = fVar28 * fVar15;
  auVar10._8_4_ = fVar29 * fVar15;
  auVar10._12_4_ = fVar31 * fVar15;
  auVar10 = vsubps_avx(auVar26,auVar10);
  (__return_storage_ptr__->L).values.values[0] = auVar17._0_4_ * fVar9;
  (__return_storage_ptr__->L).values.values[1] = auVar17._4_4_ * fVar9;
  (__return_storage_ptr__->L).values.values[2] = auVar17._8_4_ * fVar9;
  (__return_storage_ptr__->L).values.values[3] = auVar17._12_4_ * fVar9;
  uVar2 = vmovlps_avx(auVar10);
  (__return_storage_ptr__->ray).o.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar2;
  (__return_storage_ptr__->ray).o.super_Tuple3<pbrt::Point3,_float>.y =
       (float)(int)((ulong)uVar2 >> 0x20);
  (__return_storage_ptr__->ray).o.super_Tuple3<pbrt::Point3,_float>.z =
       (fVar15 * (fVar38 * fVar14 * fVar35 + auVar25._0_4_ + local_78 * -0.0) + fVar8) -
       local_78 * fVar15;
  uVar2 = vmovlps_avx(auVar33);
  (__return_storage_ptr__->ray).d.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar2;
  (__return_storage_ptr__->ray).d.super_Tuple3<pbrt::Vector3,_float>.y =
       (float)(int)((ulong)uVar2 >> 0x20);
  (__return_storage_ptr__->ray).d.super_Tuple3<pbrt::Vector3,_float>.z = local_78;
  (__return_storage_ptr__->ray).time = time;
  (__return_storage_ptr__->ray).medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = 0;
  (__return_storage_ptr__->intr).set = false;
  __return_storage_ptr__->pdfPos = 1.0 / (fVar15 * fVar15 * 3.1415927);
  __return_storage_ptr__->pdfDir = 0.07957747;
  return __return_storage_ptr__;
}

Assistant:

LightLeSample UniformInfiniteLight::SampleLe(const Point2f &u1, const Point2f &u2,
                                             SampledWavelengths &lambda,
                                             Float time) const {
    Vector3f w = SampleUniformSphere(u1);
    // Compute infinite light sample ray
    Frame wFrame = Frame::FromZ(-w);
    Point2f cd = SampleUniformDiskConcentric(u2);
    Point3f pDisk = sceneCenter + sceneRadius * wFrame.FromLocal(Vector3f(cd.x, cd.y, 0));
    Ray ray(pDisk + sceneRadius * -w, w, time);

    // Compute probabilities for uniform infinite light
    Float pdfPos = 1 / (Pi * Sqr(sceneRadius));
    Float pdfDir = UniformSpherePDF();

    return LightLeSample(scale * Lemit.Sample(lambda), ray, pdfPos, pdfDir);
}